

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall QItemSelectionModelPrivate::modelDestroyed(QItemSelectionModelPrivate *this)

{
  (this->model).super_QPropertyData<QAbstractItemModel_*>.val = (QAbstractItemModel *)0x0;
  disconnectModel(this);
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::notify(&this->model);
  return;
}

Assistant:

void QItemSelectionModelPrivate::modelDestroyed()
{
    model.setValueBypassingBindings(nullptr);
    disconnectModel();
    model.notify();
}